

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.c
# Opt level: O0

void ggml_barrier(ggml_threadpool *tp)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  long in_RDI;
  int n_barrier;
  int n_passed;
  int n_threads;
  
  if (*(int *)(in_RDI + 0x11c) != 1) {
    iVar3 = *(int *)(in_RDI + 0xc0);
    LOCK();
    piVar1 = (int *)(in_RDI + 0x80);
    iVar2 = *piVar1;
    *piVar1 = *piVar1 + 1;
    UNLOCK();
    if (iVar2 == *(int *)(in_RDI + 0x11c) + -1) {
      *(undefined4 *)(in_RDI + 0x80) = 0;
      LOCK();
      *(int *)(in_RDI + 0xc0) = *(int *)(in_RDI + 0xc0) + 1;
      UNLOCK();
    }
    else {
      while (*(int *)(in_RDI + 0xc0) == iVar3) {
        ggml_thread_cpu_relax();
      }
    }
  }
  return;
}

Assistant:

void ggml_barrier(struct ggml_threadpool * tp) {
    int n_threads = atomic_load_explicit(&tp->n_threads_cur, memory_order_relaxed);
    if (n_threads == 1) {
        return;
    }

#ifdef GGML_USE_OPENMP
    #pragma omp barrier
#else
    int n_passed = atomic_load_explicit(&tp->n_barrier_passed, memory_order_relaxed);

    // enter barrier (full seq-cst fence)
    int n_barrier = atomic_fetch_add_explicit(&tp->n_barrier, 1, memory_order_seq_cst);

    if (n_barrier == (n_threads - 1)) {
        // last thread
        atomic_store_explicit(&tp->n_barrier, 0, memory_order_relaxed);

        // exit barrier (fill seq-cst fence)
        atomic_fetch_add_explicit(&tp->n_barrier_passed, 1, memory_order_seq_cst);
        return;
    }

    // wait for other threads
    while (atomic_load_explicit(&tp->n_barrier_passed, memory_order_relaxed) == n_passed) {
        ggml_thread_cpu_relax();
    }

    // exit barrier (full seq-cst fence)
    // TSAN doesn't support standalone fence yet, we use a dummy read-modify-write instead
    #ifdef GGML_TSAN_ENABLED
    atomic_fetch_add_explicit(&tp->n_barrier_passed, 0, memory_order_seq_cst);
    #else
    atomic_thread_fence(memory_order_seq_cst);
    #endif
#endif
}